

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::CallExpression::fromArgs
          (CallExpression *this,Compilation *compilation,Subroutine *subroutine,
          Expression *thisClass,ArgumentListSyntax *argSyntax,SourceRange range,ASTContext *context)

{
  char *pcVar1;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  *this_00;
  undefined4 uVar2;
  SubroutineSymbol *this_01;
  int *piVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  SourceRange range_00;
  SourceRange sourceRange;
  bool bVar6;
  int iVar7;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar8;
  Type *args_1;
  undefined4 extraout_var;
  DriverVisitor *expr;
  SourceLocation SVar9;
  ProceduralBlockSymbol *pPVar10;
  Statement *this_02;
  EVP_PKEY_CTX *src;
  SubroutineSymbol *extraout_RDX;
  ulong pos0;
  DiagCode code;
  DriverVisitor *visitor;
  uint uVar11;
  ulong uVar12;
  ulong hash;
  long lVar13;
  ulong uVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  ArgList formalArgs;
  SourceRange range_01;
  SmallVector<const_slang::ast::Expression_*,_5UL> boundArgs;
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  visitedSubs;
  SubroutineSymbol *local_1c0;
  SourceRange local_1b8;
  Expression *local_1a8;
  ulong local_1a0;
  char local_198;
  char cStack_197;
  char cStack_196;
  byte bStack_195;
  char cStack_194;
  char cStack_193;
  char cStack_192;
  byte bStack_191;
  char cStack_190;
  char cStack_18f;
  char cStack_18e;
  byte bStack_18d;
  char cStack_18c;
  char cStack_18b;
  char cStack_18a;
  byte bStack_189;
  SmallVectorBase<const_slang::ast::Expression_*> local_188 [2];
  undefined1 local_148 [48];
  byte local_118;
  ulong local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  undefined1 local_e8 [160];
  SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
  *local_48;
  
  local_188[0].data_ = (pointer)local_188[0].firstElement;
  local_188[0].len = 0;
  local_188[0].cap = 5;
  local_1b8.startLoc = (SourceLocation)argSyntax;
  local_1b8.endLoc = (SourceLocation)context;
  local_1a8 = (Expression *)subroutine;
  ppSVar8 = std::
            get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                      ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        *)compilation);
  this_01 = *ppSVar8;
  formalArgs = SubroutineSymbol::getArguments(this_01);
  range_00.endLoc = local_1b8.endLoc;
  range_00.startLoc = local_1b8.startLoc;
  bVar6 = bindArgs((ArgumentListSyntax *)thisClass,formalArgs,(this_01->super_Symbol).name,range_00,
                   (ASTContext *)range.startLoc,local_188,
                   (bool)((byte)((this_01->flags).m_bits >> 9) & 1));
  local_1c0 = this_01;
  args_1 = DeclaredType::getType(&this_01->declaredReturnType);
  iVar7 = SmallVectorBase<const_slang::ast::Expression_*>::copy(local_188,(EVP_PKEY_CTX *)this,src);
  local_e8._0_8_ = CONCAT44(extraout_var,iVar7);
  SVar9 = (SourceLocation)local_e8;
  local_148._0_8_ = *(undefined8 *)range.startLoc;
  local_148._8_4_ = *(uint32_t *)((long)range.startLoc + 8);
  local_e8._8_8_ = extraout_RDX;
  expr = (DriverVisitor *)
         BumpAllocator::
         emplace<slang::ast::CallExpression,slang::ast::SubroutineSymbol_const*,slang::ast::Type_const&,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::LookupLocation,slang::SourceRange&>
                   ((BumpAllocator *)this,&local_1c0,args_1,&local_1a8,
                    (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)SVar9,
                    (LookupLocation *)local_148,&local_1b8);
  if (bVar6) {
    if (((*(byte *)((long)range.startLoc + 0x11) & 0x18) != 0) && (this_01->subroutineKind == Task))
    {
      code.subsystem = Expressions;
      code.code = 0x9c;
      SVar9 = range.startLoc;
      while (*(long *)SVar9 != 0) {
        piVar3 = *(int **)(*(long *)SVar9 + 8);
        iVar7 = *piVar3;
        if (iVar7 != 0x3a) {
          if (iVar7 == 0x40) {
            code.subsystem = Expressions;
            code.code = 0x9d;
          }
          break;
        }
        SVar9 = (SourceLocation)(piVar3 + 8);
      }
      sourceRange.endLoc = local_1b8.endLoc;
      sourceRange.startLoc = local_1b8.startLoc;
      ASTContext::addDiag((ASTContext *)range.startLoc,code,sourceRange);
      visitor = expr;
      expr = (DriverVisitor *)Expression::badExpr((Compilation *)this,(Expression *)expr);
      goto LAB_0032eaa7;
    }
    bVar6 = SubroutineSymbol::hasOutputArgs(this_01);
    visitor = (DriverVisitor *)(ulong)bVar6;
    range_01.endLoc = SVar9;
    range_01.startLoc = local_1b8.endLoc;
    bVar6 = checkOutputArgs((ast *)range.startLoc,(ASTContext *)visitor,local_1b8.startLoc._0_1_,
                            range_01);
    if (bVar6) {
      if ((((local_1a8 == (Expression *)0x0) && (this_01->subroutineKind == Function)) &&
          (pPVar10 = ASTContext::getProceduralBlock((ASTContext *)range.startLoc),
          pPVar10 != (ProceduralBlockSymbol *)0x0)) &&
         (bVar6 = Scope::isUninstantiated(*(Scope **)range.startLoc), !bVar6)) {
        SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
        ::SmallSet((SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                    *)local_148);
        this_00 = (table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                   *)(local_148 + 0x28);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = this_01;
        hash = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
        pos0 = hash >> (local_118 & 0x3f);
        uVar2 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        local_1a0 = local_110;
        uVar12 = 0;
        uVar14 = pos0;
        do {
          pcVar1 = (char *)(local_108 + uVar14 * 0x10);
          local_198 = *pcVar1;
          cStack_197 = pcVar1[1];
          cStack_196 = pcVar1[2];
          bStack_195 = pcVar1[3];
          cStack_194 = pcVar1[4];
          cStack_193 = pcVar1[5];
          cStack_192 = pcVar1[6];
          bStack_191 = pcVar1[7];
          cStack_190 = pcVar1[8];
          cStack_18f = pcVar1[9];
          cStack_18e = pcVar1[10];
          bStack_18d = pcVar1[0xb];
          cStack_18c = pcVar1[0xc];
          cStack_18b = pcVar1[0xd];
          cStack_18a = pcVar1[0xe];
          bStack_189 = pcVar1[0xf];
          cVar15 = (char)uVar2;
          auVar19[0] = -(local_198 == cVar15);
          cVar16 = (char)((uint)uVar2 >> 8);
          auVar19[1] = -(cStack_197 == cVar16);
          cVar17 = (char)((uint)uVar2 >> 0x10);
          auVar19[2] = -(cStack_196 == cVar17);
          bVar18 = (byte)((uint)uVar2 >> 0x18);
          auVar19[3] = -(bStack_195 == bVar18);
          auVar19[4] = -(cStack_194 == cVar15);
          auVar19[5] = -(cStack_193 == cVar16);
          auVar19[6] = -(cStack_192 == cVar17);
          auVar19[7] = -(bStack_191 == bVar18);
          auVar19[8] = -(cStack_190 == cVar15);
          auVar19[9] = -(cStack_18f == cVar16);
          auVar19[10] = -(cStack_18e == cVar17);
          auVar19[0xb] = -(bStack_18d == bVar18);
          auVar19[0xc] = -(cStack_18c == cVar15);
          auVar19[0xd] = -(cStack_18b == cVar16);
          auVar19[0xe] = -(cStack_18a == cVar17);
          auVar19[0xf] = -(bStack_189 == bVar18);
          for (uVar11 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe); uVar11 != 0;
              uVar11 = uVar11 - 1 & uVar11) {
            uVar4 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            local_1c0 = this_01;
            if (*(SubroutineSymbol **)(local_100 + (uVar14 * 0xf + (ulong)uVar4) * 8) == this_01)
            goto LAB_0032ea41;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_189) == 0) break;
          lVar13 = uVar14 + uVar12;
          uVar12 = uVar12 + 1;
          uVar14 = lVar13 + 1U & local_110;
        } while (uVar12 <= local_110);
        if (local_f0 < local_f8) {
          local_1c0 = this_01;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
          ::unchecked_emplace_at<slang::ast::SubroutineSymbol_const*>
                    ((locator *)local_e8,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
                      *)this_00,pos0,hash,&local_1c0);
        }
        else {
          local_1c0 = this_01;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::ast::SubroutineSymbol_const*>
                    ((locator *)local_e8,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::SubroutineSymbol_const*,32ul,16ul>>
                      *)this_00,hash,&local_1c0);
        }
LAB_0032ea41:
        local_e8._0_8_ = pPVar10;
        local_e8._8_8_ = this_01;
        local_e8._16_8_ = expr;
        SmallSet<const_slang::ast::ValueSymbol_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
        ::SmallSet((SmallSet<const_slang::ast::ValueSymbol_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                    *)(local_e8 + 0x20));
        local_48 = (SmallSet<const_slang::ast::SubroutineSymbol_*,_4UL,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
                    *)local_148;
        this_02 = SubroutineSymbol::getBody(this_01);
        visitor = (DriverVisitor *)local_e8;
        Statement::visit<slang::ast::DriverVisitor&>(this_02,visitor);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
        ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::ValueSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
                       *)(local_e8 + 0x68));
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_slang::detail::hashing::StackAllocator<const_slang::ast::SubroutineSymbol_*,_32UL,_16UL>_>
        ::~table_core(this_00);
      }
      goto LAB_0032eaa7;
    }
  }
  visitor = expr;
  expr = (DriverVisitor *)Expression::badExpr((Compilation *)this,(Expression *)expr);
LAB_0032eaa7:
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup(local_188,(EVP_PKEY_CTX *)visitor);
  return (Expression *)expr;
}

Assistant:

Expression& CallExpression::fromArgs(Compilation& compilation, const Subroutine& subroutine,
                                     const Expression* thisClass,
                                     const ArgumentListSyntax* argSyntax, SourceRange range,
                                     const ASTContext& context) {
    SmallVector<const Expression*> boundArgs;
    const SubroutineSymbol& symbol = *std::get<0>(subroutine);
    bool bad = !bindArgs(argSyntax, symbol.getArguments(), symbol.name, range, context, boundArgs,
                         symbol.flags.has(MethodFlags::BuiltIn));

    auto result = compilation.emplace<CallExpression>(&symbol, symbol.getReturnType(), thisClass,
                                                      boundArgs.copy(compilation),
                                                      context.getLocation(), range);
    if (bad)
        return badExpr(compilation, result);

    if (context.flags.has(ASTFlags::Function | ASTFlags::Final) &&
        symbol.subroutineKind == SubroutineKind::Task) {
        const Scope* scope = context.scope;
        while (scope && scope->asSymbol().kind == SymbolKind::StatementBlock)
            scope = scope->asSymbol().getParentScope();

        if (scope && scope->asSymbol().kind == SymbolKind::Subroutine)
            context.addDiag(diag::TaskFromFunction, range);
        else
            context.addDiag(diag::TaskFromFinal, range);

        return badExpr(compilation, result);
    }

    if (!checkOutputArgs(context, symbol.hasOutputArgs(), range))
        return badExpr(compilation, result);

    // If this subroutine is invoked from a procedure, register drivers for this
    // particular procedure to detect multiple driver violations.
    if (!thisClass && symbol.subroutineKind == SubroutineKind::Function) {
        if (auto proc = context.getProceduralBlock(); proc && !context.scope->isUninstantiated())
            addSubroutineDrivers(*proc, symbol, *result);
    }

    return *result;
}